

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int iTarget)

{
  uint uVar1;
  Expr *pX;
  Vdbe *p;
  int iVar2;
  int iVar3;
  InLoop *pIVar4;
  long lVar5;
  int iVar6;
  int op;
  bool bVar7;
  bool bVar8;
  
  pX = pTerm->pExpr;
  p = pParse->pVdbe;
  if (pX->op == 'I') {
    iVar3 = 10;
    iVar6 = 0;
    iVar2 = iTarget;
  }
  else {
    if (pX->op == 'L') {
      iTarget = sqlite3ExprCodeTarget(pParse,pX->pRight,iTarget);
      goto LAB_0016c129;
    }
    uVar1 = (pLevel->plan).wsFlags;
    bVar8 = (bool)((byte)(uVar1 >> 0x18) & 1);
    if ((uVar1 & 0xf0000) != 0) {
      bVar8 = (bool)(bVar8 ^ ((pLevel->plan).u.pIdx)->aSortOrder[iEq] != '\0');
    }
    iVar2 = sqlite3FindInIndex(pParse,pX,(int *)0x0);
    bVar7 = bVar8 == false;
    if (iVar2 != 4) {
      bVar7 = bVar8;
    }
    iVar6 = pX->iTable;
    sqlite3VdbeAddOp3(p,(uint)(bVar7 == false) * 5 + 0x43,iVar6,0,0);
    if ((pLevel->u).in.nIn == 0) {
      iVar3 = sqlite3VdbeMakeLabel(p);
      pLevel->addrNxt = iVar3;
    }
    iVar3 = (pLevel->u).in.nIn;
    (pLevel->u).in.nIn = iVar3 + 1;
    pIVar4 = (InLoop *)sqlite3DbReallocOrFree(pParse->db,(pLevel->u).in.aInLoop,(iVar3 * 4 + 4) * 3)
    ;
    (pLevel->u).in.aInLoop = pIVar4;
    if (pIVar4 == (InLoop *)0x0) {
      (pLevel->u).in.nIn = 0;
      goto LAB_0016c129;
    }
    lVar5 = (long)(pLevel->u).in.nIn;
    pIVar4[lVar5 + -1].iCur = iVar6;
    if (iVar2 == 1) {
      op = 0x41;
      iVar2 = iTarget;
      iVar3 = 0;
    }
    else {
      op = 0x1d;
      iVar2 = 0;
      iVar3 = iTarget;
    }
    iVar2 = sqlite3VdbeAddOp3(p,op,iVar6,iVar2,iVar3);
    pIVar4[lVar5 + -1].addrInTop = iVar2;
    pIVar4[lVar5 + -1].eEndLoopOp = (bVar7 == false) * '\x03' + '\\';
    iVar3 = 0x49;
    iVar2 = 0;
    iVar6 = iTarget;
  }
  sqlite3VdbeAddOp3(p,iVar3,iVar6,iVar2,0);
LAB_0016c129:
  disableTerm(pLevel,pTerm);
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( iTarget>0 );
  if( pX->op==TK_EQ ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType;
    int iTab;
    struct InLoop *pIn;
    u8 bRev = (pLevel->plan.wsFlags & WHERE_REVERSE)!=0;

    if( (pLevel->plan.wsFlags & WHERE_INDEXED)!=0 
      && pLevel->plan.u.pIdx->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( iEq==pLevel->plan.u.pIdx->nColumn-1 );
      testcase( iEq>0 && iEq+1<pLevel->plan.u.pIdx->nColumn );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;
    eType = sqlite3FindInIndex(pParse, pX, 0);
    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    iTab = pX->iTable;
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    assert( pLevel->plan.wsFlags & WHERE_IN_ABLE );
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(v);
    }
    pLevel->u.in.nIn++;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      pIn += pLevel->u.in.nIn - 1;
      pIn->iCur = iTab;
      if( eType==IN_INDEX_ROWID ){
        pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iReg);
      }else{
        pIn->addrInTop = sqlite3VdbeAddOp3(v, OP_Column, iTab, 0, iReg);
      }
      pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
      sqlite3VdbeAddOp1(v, OP_IsNull, iReg);
    }else{
      pLevel->u.in.nIn = 0;
    }
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}